

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int fprintfConsumer(jx9_context *pCtx,char *zInput,int nLen,void *pUserData)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (**(code **)(**pUserData + 0x40))((*pUserData)[1],zInput,(long)nLen);
  if (lVar2 < 1) {
    iVar1 = -10;
  }
  else {
    *(long *)((long)pUserData + 8) = *(long *)((long)pUserData + 8) + lVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int fprintfConsumer(jx9_context *pCtx, const char *zInput, int nLen, void *pUserData)
{
	fprintf_data *pFdata = (fprintf_data *)pUserData;
	jx9_int64 n;
	/* Write the formatted data */
	n = pFdata->pIO->pStream->xWrite(pFdata->pIO->pHandle, (const void *)zInput, nLen);
	if( n < 1 ){
		SXUNUSED(pCtx); /* cc warning */
		/* IO error, abort immediately */
		return SXERR_ABORT;
	}
	/* Increment counter */
	pFdata->nCount += n;
	return JX9_OK;
}